

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O1

void printCompositorTypeConnector(COMPOSITOR_TYPE type)

{
  if (type - COMPOSITOR_SEQUENCE < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               &DAT_00108724 + *(int *)(&DAT_00108724 + (ulong)(type - COMPOSITOR_SEQUENCE) * 4),1);
    return;
  }
  return;
}

Assistant:

void printCompositorTypeConnector(XSModelGroup::COMPOSITOR_TYPE type)
{
    switch (type) {
        case XSModelGroup::COMPOSITOR_SEQUENCE :
            std::cout << ",";
            break;
        case XSModelGroup::COMPOSITOR_CHOICE :
            std::cout << "|";
            break;
        case XSModelGroup::COMPOSITOR_ALL :
            std::cout << "*";
            break;
    }
}